

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O1

int ixxx::posix::pipe(int *__pipedes)

{
  int iVar1;
  pipe_error *this;
  int *piVar2;
  
  iVar1 = ::pipe(__pipedes);
  if (iVar1 != -1) {
    return iVar1;
  }
  this = (pipe_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  pipe_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
  __cxa_throw(this,&pipe_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

void pipe(int pipefd[2])
    {
#if defined(__MINGW32__) || defined(__MINGW64__)
        int r = ::_pipe(pipefd, 4*1024, _O_BINARY);
#else
        int r = ::pipe(pipefd);
#endif
        if (r == -1)
            throw pipe_error(errno);
    }